

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall
QDataWidgetMapperPrivate::closeEditor(QDataWidgetMapperPrivate *this,QWidget *w,EndEditHint hint)

{
  int iVar1;
  reference m;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  
  iVar1 = findWidget(this,w);
  if (iVar1 == -1) {
    return;
  }
  if (hint == EditNextItem) {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
    uVar2 = 1;
  }
  else {
    if (hint != EditPreviousItem) {
      if (hint != RevertModelCache) {
        return;
      }
      m = std::
          vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
          ::operator[](&this->widgetMap,(long)iVar1);
      populate(this,m);
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
    uVar2 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(w,uVar2);
  return;
}

Assistant:

void QDataWidgetMapperPrivate::closeEditor(QWidget *w, QAbstractItemDelegate::EndEditHint hint)
{
    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    switch (hint) {
    case QAbstractItemDelegate::RevertModelCache: {
        populate(widgetMap[idx]);
        break; }
    case QAbstractItemDelegate::EditNextItem:
        w->focusNextChild();
        break;
    case QAbstractItemDelegate::EditPreviousItem:
        w->focusPreviousChild();
        break;
    case QAbstractItemDelegate::SubmitModelCache:
    case QAbstractItemDelegate::NoHint:
        // nothing
        break;
    }
}